

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int wb_consume(archive_write *a,size_t size)

{
  void *pvVar1;
  iso9660_conflict *iso9660;
  size_t size_local;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  if ((*(ulong *)((long)pvVar1 + 0x102e0) < size) || (*(long *)((long)pvVar1 + 0x102e0) == 0)) {
    archive_set_error(&a->archive,-1,
                      "Internal Programing error: iso9660:wb_consume() size=%jd, wbuff_remaining=%jd"
                      ,size,*(undefined8 *)((long)pvVar1 + 0x102e0));
    a_local._4_4_ = -0x1e;
  }
  else {
    *(size_t *)((long)pvVar1 + 0x102e0) = *(long *)((long)pvVar1 + 0x102e0) - size;
    if (*(ulong *)((long)pvVar1 + 0x102e0) < 0x800) {
      a_local._4_4_ = wb_write_out(a);
    }
    else {
      a_local._4_4_ = 0;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
wb_consume(struct archive_write *a, size_t size)
{
	struct iso9660 *iso9660 = (struct iso9660 *)a->format_data;

	if (size > iso9660->wbuff_remaining ||
	    iso9660->wbuff_remaining == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Internal Programing error: iso9660:wb_consume()"
		    " size=%jd, wbuff_remaining=%jd",
		    (intmax_t)size, (intmax_t)iso9660->wbuff_remaining);
		return (ARCHIVE_FATAL);
	}
	iso9660->wbuff_remaining -= size;
	if (iso9660->wbuff_remaining < LOGICAL_BLOCK_SIZE)
		return (wb_write_out(a));
	return (ARCHIVE_OK);
}